

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

Bool Conic_To(black_PWorker worker,Long cx,Long cy,Long x,Long y)

{
  ulong uVar1;
  ulong uVar2;
  Long LVar3;
  bool overshoot;
  Bool BVar4;
  char cVar5;
  TStates aState;
  TPoint *pTStack_490;
  Bool o;
  TPoint *arc;
  TPoint arcs [65];
  ulong uStack_68;
  TStates state_bez;
  Long ymax;
  Long ymin;
  Long x3;
  Long y3;
  Long y2;
  Long y1;
  Long y_local;
  Long x_local;
  Long cy_local;
  Long cx_local;
  black_PWorker worker_local;
  
  pTStack_490 = (TPoint *)&arc;
  arcs[1].y = worker->lastX;
  arcs[2].x = worker->lastY;
  arcs[0].y = cx;
  arcs[1].x = cy;
  arc = (TPoint *)x;
  arcs[0].x = y;
  do {
    uVar1 = pTStack_490[2].y;
    uVar2 = pTStack_490->y;
    LVar3 = pTStack_490->x;
    uStack_68 = uVar1;
    ymax = uVar2;
    if ((long)uVar1 <= (long)uVar2) {
      uStack_68 = uVar2;
      ymax = uVar1;
    }
    if ((pTStack_490[1].y < ymax) || ((long)uStack_68 < pTStack_490[1].y)) {
      Split_Conic(pTStack_490);
      pTStack_490 = pTStack_490 + 2;
    }
    else {
      if (uVar1 != uVar2) {
        aState = Descending_State;
        if ((long)uVar1 < (long)uVar2) {
          aState = Ascending_State;
        }
        if (worker->state != aState) {
          if (aState == Ascending_State) {
            overshoot = (long)worker->precision_half <=
                        (long)(((uVar1 + (long)worker->precision) - 1 & (long)-worker->precision) -
                              uVar1);
          }
          else {
            overshoot = (long)worker->precision_half <=
                        (long)(uVar1 - (uVar1 & (long)-worker->precision));
          }
          if ((worker->state != Unknown_State) &&
             (BVar4 = End_Profile(worker,overshoot), BVar4 != '\0')) {
            return '\x01';
          }
          BVar4 = New_Profile(worker,aState,overshoot);
          if (BVar4 != '\0') {
            return '\x01';
          }
        }
        if (aState == Ascending_State) {
          cVar5 = Bezier_Up(worker,2,pTStack_490,Split_Conic,worker->minY,worker->maxY);
        }
        else {
          cVar5 = Bezier_Down(worker,2,pTStack_490,Split_Conic,worker->minY,worker->maxY);
        }
        if (cVar5 != '\0') {
          return '\x01';
        }
      }
      pTStack_490 = pTStack_490 + -2;
    }
    if (pTStack_490 < (TPoint *)&arc) {
      worker->lastX = LVar3;
      worker->lastY = uVar2;
      return '\0';
    }
  } while( true );
}

Assistant:

static Bool
  Conic_To( RAS_ARGS Long  cx,
                     Long  cy,
                     Long  x,
                     Long  y )
  {
    Long     y1, y2, y3, x3, ymin, ymax;
    TStates  state_bez;
    TPoint   arcs[2 * MaxBezier + 1]; /* The Bezier stack           */
    TPoint*  arc;                     /* current Bezier arc pointer */


    arc      = arcs;
    arc[2].x = ras.lastX;
    arc[2].y = ras.lastY;
    arc[1].x = cx;
    arc[1].y = cy;
    arc[0].x = x;
    arc[0].y = y;

    do
    {
      y1 = arc[2].y;
      y2 = arc[1].y;
      y3 = arc[0].y;
      x3 = arc[0].x;

      /* first, categorize the Bezier arc */

      if ( y1 <= y3 )
      {
        ymin = y1;
        ymax = y3;
      }
      else
      {
        ymin = y3;
        ymax = y1;
      }

      if ( y2 < ymin || y2 > ymax )
      {
        /* this arc has no given direction, split it! */
        Split_Conic( arc );
        arc += 2;
      }
      else if ( y1 == y3 )
      {
        /* this arc is flat, ignore it and pop it from the Bezier stack */
        arc -= 2;
      }
      else
      {
        /* the arc is y-monotonous, either ascending or descending */
        /* detect a change of direction                            */
        state_bez = y1 < y3 ? Ascending_State : Descending_State;
        if ( ras.state != state_bez )
        {
          Bool  o = ( state_bez == Ascending_State )
                      ? IS_BOTTOM_OVERSHOOT( y1 )
                      : IS_TOP_OVERSHOOT( y1 );


          /* finalize current profile if any */
          if ( ras.state != Unknown_State &&
               End_Profile( RAS_VARS o )  )
            goto Fail;

          /* create a new profile */
          if ( New_Profile( RAS_VARS state_bez, o ) )
            goto Fail;
        }

        /* now call the appropriate routine */
        if ( state_bez == Ascending_State )
        {
          if ( Bezier_Up( RAS_VARS 2, arc, Split_Conic,
                                   ras.minY, ras.maxY ) )
            goto Fail;
        }
        else
          if ( Bezier_Down( RAS_VARS 2, arc, Split_Conic,
                                     ras.minY, ras.maxY ) )
            goto Fail;
        arc -= 2;
      }

    } while ( arc >= arcs );

    ras.lastX = x3;
    ras.lastY = y3;

    return SUCCESS;

  Fail:
    return FAILURE;
  }